

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

int main(void)

{
  uint __line;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  string *this;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar8;
  char *__assertion;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_> tssv;
  vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_> sv;
  Stack<8UL> fa;
  
  std::_Vector_base<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>::_Vector_impl
  ::_Vector_impl((_Vector_impl *)&sv);
  std::_Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>::
  _Vector_impl::_Vector_impl((_Vector_impl *)&tssv);
  lVar8 = 10000000;
  lVar4 = std::chrono::_V2::system_clock::now();
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    this = (string *)operator_new(0x20);
    std::__cxx11::string::string(this,"3",(allocator *)&fa);
    std::__cxx11::string::~string(this);
    operator_delete(this);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"Classic:               ");
  fVar10 = (float)(lVar8 - lVar4) / 1e+09;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar10);
  poVar5 = std::operator<<(poVar5,"s");
  std::endl<char,std::char_traits<char>>(poVar5);
  fa.super_IStack._vptr_IStack = (_func_int **)&PTR__IStack_00109c88;
  lVar8 = 10000000;
  lVar4 = std::chrono::_V2::system_clock::now();
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    iVar1 = (*fa.super_IStack._vptr_IStack[6])(&fa,8,8);
    *(undefined8 *)CONCAT44(extraout_var,iVar1) = 0x3ff0000000000000;
    iVar2 = (*fa.super_IStack._vptr_IStack[6])(&fa,4,4);
    *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 2;
    pbVar6 = AO::Allocator::Version_1::Stack<44ul>::create<std::__cxx11::string,char_const(&)[2]>
                       ((Stack<44ul> *)&fa,(char (*) [2])"3");
    AO::Allocator::Version_1::Stack<44ul>::destroy<std::__cxx11::string>((Stack<44ul> *)&fa,pbVar6);
    (*fa.super_IStack._vptr_IStack[7])(&fa,(undefined4 *)CONCAT44(extraout_var_00,iVar2),4);
    (*fa.super_IStack._vptr_IStack[7])(&fa,(undefined8 *)CONCAT44(extraout_var,iVar1),8);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"Thread-Safe Allocator: ");
  fVar11 = (float)(lVar8 - lVar4) / 1e+09;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar11);
  poVar5 = std::operator<<(poVar5,"s");
  std::endl<char,std::char_traits<char>>(poVar5);
  fa.super_IStack._vptr_IStack = (_func_int **)&PTR__IStack_00109d08;
  lVar8 = 10000000;
  lVar4 = std::chrono::_V2::system_clock::now();
  while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
    iVar1 = (*fa.super_IStack._vptr_IStack[6])(&fa,8,8);
    *(undefined8 *)CONCAT44(extraout_var_01,iVar1) = 0x3ff0000000000000;
    iVar2 = (*fa.super_IStack._vptr_IStack[6])(&fa,4,4);
    *(undefined4 *)CONCAT44(extraout_var_02,iVar2) = 2;
    pbVar6 = AO::Allocator::Version_1::Stack<44ul>::create<std::__cxx11::string,char_const(&)[2]>
                       ((Stack<44ul> *)&fa,(char (*) [2])"3");
    AO::Allocator::Version_1::Stack<44ul>::destroy<std::__cxx11::string>((Stack<44ul> *)&fa,pbVar6);
    (*fa.super_IStack._vptr_IStack[7])(&fa,(undefined4 *)CONCAT44(extraout_var_02,iVar2),4);
    (*fa.super_IStack._vptr_IStack[7])(&fa,(undefined8 *)CONCAT44(extraout_var_01,iVar1),8);
  }
  lVar8 = std::chrono::_V2::system_clock::now();
  poVar5 = std::operator<<((ostream *)&std::cout,"Unsafe Allocator:      ");
  fVar12 = (float)(lVar8 - lVar4) / 1e+09;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar12);
  poVar5 = std::operator<<(poVar5,"s");
  std::endl<char,std::char_traits<char>>(poVar5);
  if ((fVar10 <= fVar11) || (fVar11 <= fVar12)) {
    __assertion = 
    "unsafeDuration < threadSafeDuration && threadSafeDuration < classicDuration && \"Allocator is too slow\""
    ;
    __line = 0x49;
  }
  else {
    fa.super_IStack._vptr_IStack = (_func_int **)&PTR__IStack_00109d58;
    fa.bufferSize = 0;
    puVar7 = (undefined4 *)AO::Allocator::Version_1::Stack<8UL>::allocate(&fa,4,4);
    *puVar7 = 1;
    if (fa.bufferSize == 4) {
      iVar1 = (*fa.super_IStack._vptr_IStack[6])(&fa,2);
      *(undefined2 *)CONCAT44(extraout_var_03,iVar1) = 2;
      if (fa.bufferSize == 6) {
        iVar2 = (*fa.super_IStack._vptr_IStack[6])(&fa,2);
        *(undefined2 *)CONCAT44(extraout_var_04,iVar2) = 3;
        if (fa.bufferSize == 8) {
          iVar3 = (*fa.super_IStack._vptr_IStack[6])(&fa,4);
          *(undefined4 *)CONCAT44(extraout_var_05,iVar3) = 4;
          if (fa.bufferSize == 8) {
            (*fa.super_IStack._vptr_IStack[7])(&fa,(undefined4 *)CONCAT44(extraout_var_05,iVar3),4);
            if (fa.bufferSize == 8) {
              (*fa.super_IStack._vptr_IStack[7])
                        (&fa,(undefined2 *)CONCAT44(extraout_var_04,iVar2),2);
              if (fa.bufferSize == 6) {
                (*fa.super_IStack._vptr_IStack[7])
                          (&fa,(undefined2 *)CONCAT44(extraout_var_03,iVar1),2);
                if (fa.bufferSize == 4) {
                  (*fa.super_IStack._vptr_IStack[7])(&fa,puVar7,4);
                  if (fa.bufferSize == 0) {
                    poVar5 = std::operator<<((ostream *)&std::cout,"Success!");
                    std::endl<char,std::char_traits<char>>(poVar5);
                    std::
                    _Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>
                    ::~_Vector_base(&tssv.
                                     super__Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>
                                   );
                    std::
                    _Vector_base<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>::
                    ~_Vector_base(&sv.
                                   super__Vector_base<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>
                                 );
                    return 0;
                  }
                  __assertion = "fa.empty() && fa.size() == 0 && \"Allocator should be empty\"";
                  __line = 0x62;
                }
                else {
                  __assertion = 
                  "!fa.empty() && fa.size() == sizeof(int) && \"Allocator should contain 1 element\""
                  ;
                  __line = 0x5f;
                }
              }
              else {
                __assertion = 
                "!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && \"Allocator should contain 2 elements\""
                ;
                __line = 0x5c;
              }
            }
            else {
              __assertion = 
              "!fa.empty() && fa.size() == fa.capacity() && \"Allocator should still be full (because the last element was out of stack bounds)\""
              ;
              __line = 0x59;
            }
          }
          else {
            __assertion = 
            "!fa.empty() && fa.size() == fa.capacity() && \"Allocator should be full\"";
            __line = 0x57;
          }
        }
        else {
          __assertion = "!fa.empty() && fa.size() == fa.capacity() && \"Allocator should be full\"";
          __line = 0x54;
        }
      }
      else {
        __assertion = 
        "!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && \"Allocator should contain 2 elements\""
        ;
        __line = 0x51;
      }
    }
    else {
      __assertion = 
      "!fa.empty() && fa.size() == sizeof(int) && \"Allocator should contain 1 element\"";
      __line = 0x4e;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                ,__line,"int main()");
}

Assistant:

int main(void)
{
	std::vector<int, AO::Allocator::StackAllocator<int>> sv;
	std::vector<int, AO::Allocator::ThreadSafeStackAllocator<int>> tssv;
	float const classicDuration = testClassic();
	float const threadSafeDuration = testThreadSafeAllocator();
	float const unsafeDuration = testUnsafeAllocator();
	assert(unsafeDuration < threadSafeDuration && threadSafeDuration < classicDuration && "Allocator is too slow");
	AO::Allocator::Stack<2 * sizeof(short) + sizeof(int)> fa;
	assert(fa.empty() && fa.size() == 0 && "Allocator should be empty");
	int *const value1 = fa.create<int>(1);
	assert(*value1 == 1 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) && "Allocator should contain 1 element");
	short *const value2 = fa.create<short>(2);
	assert(*value2 == 2 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && "Allocator should contain 2 elements");
	short *const value3 = fa.create<short>(3);
	assert(*value3 == 3 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should be full");
	int *const value4 = fa.create<int>(4);
	assert(*value4 == 4 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should be full");
	fa.destroy(value4);
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should still be full (because the last element was out of stack bounds)");
	fa.destroy(value3);
	//assert(*value3 == 0 && "Object not destructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && "Allocator should contain 2 elements");
	fa.destroy(value2);
	//assert(*value2 == 0 && "Object not destructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) && "Allocator should contain 1 element");
	fa.destroy(value1);
	//assert(*value1 == 0 && "Object not destructed properly");
	assert(fa.empty() && fa.size() == 0 && "Allocator should be empty");
	std::cout << "Success!" << std::endl;
	return 0;
}